

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O1

int wally_init(uint32_t flags)

{
  int iVar1;
  
  iVar1 = -2;
  if (flags == 0) {
    iVar1 = 0;
    if (wally_init_done == '\0') {
      sha256_optimize();
      wally_init_done = '\x01';
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_init(uint32_t flags)
{
    if (flags)
        return WALLY_EINVAL;

    if (!wally_init_done) {
        sha256_optimize();
        wally_init_done = true;
    }

    return WALLY_OK;
}